

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extprivkey.cpp
# Opt level: O2

void __thiscall
ExtPrivkey_GetExtPubkeyTest_Test::~ExtPrivkey_GetExtPubkeyTest_Test
          (ExtPrivkey_GetExtPubkeyTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtPrivkey, GetExtPubkeyTest) {
  std::string ext_base58 = "xprv9zt1onyw8BdEf7SQ6wUVH3bQQdGD9iy9QzXveQQRhX7i5iUN7jZgLbqFEe491LfjozztYa6bJAGZ65GmDCNcbjMdjZcgmdisPJwVjcfcDhV";
  ExtPrivkey extkey = ExtPrivkey(ext_base58);

  ExtPubkey pubkey = extkey.GetExtPubkey();
  EXPECT_STREQ("xpub6DsNDJWpxZBXsbWsCy1VeBY8xf6hZBgznDTXSnp3FregxWoWfGsvtQ9j5wBJNPebZXD5YmhpQBV7nVjhUsUgkG9R7yE31mh6sVh2w854a1o", pubkey.ToString().c_str());

  ext_base58 = "tprv8ZgxMBicQKsPeWHBt7a68nPnvgTnuDhUgDWC8wZCgA8GahrQ3f3uWpq7wE7Uc1dLBnCe1hhCZ886K6ND37memRDWqsA9HgSKDXtwh2Qxo6J";
  extkey = ExtPrivkey(ext_base58);
  pubkey = extkey.GetExtPubkey();
  EXPECT_STREQ("tpubD6NzVbkrYhZ4XyJymmEgYC3uVhyj4YtPFX6yRTbW6RvfRC7Ag3sVhKSz7MNzFWW5MJ7aVBKXCAX7En296EYdpo43M4a4LaeaHuhhgHToSJF", pubkey.ToString().c_str());
}